

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqlite_result_double(unqlite_context *pCtx,double Value)

{
  int iVar1;
  double Value_local;
  unqlite_context *pCtx_local;
  
  iVar1 = jx9_result_double(pCtx,Value);
  return iVar1;
}

Assistant:

int unqlite_result_double(unqlite_context *pCtx, double Value)
{
	return jx9_result_double(pCtx,Value);
}